

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O2

void __thiscall
sznet::net::KcpWithTcpServer::removeConnection(KcpWithTcpServer *this,TcpConnectionPtr *conn)

{
  KcpTcpEventLoop *this_00;
  code *local_78;
  undefined8 local_70;
  _Bind<void_(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer_*,_std::shared_ptr<sznet::net::TcpConnection>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
  local_68;
  Functor local_40;
  KcpWithTcpServer *local_20;
  
  this_00 = this->m_loop;
  local_78 = removeConnectionInLoop;
  local_70 = 0;
  local_20 = this;
  std::
  _Bind<void(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>
  ::_Bind<sznet::net::KcpWithTcpServer*,std::shared_ptr<sznet::net::TcpConnection>const&>
            ((_Bind<void(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>
              *)&local_68,(offset_in_KcpWithTcpServer_to_subr *)&local_78,&local_20,conn);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
            ((function<void()> *)&local_40,&local_68);
  EventLoop::runInLoop(&this_00->super_EventLoop,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_68._M_bound_args.
                     super__Tuple_impl<0UL,_sznet::net::KcpWithTcpServer_*,_std::shared_ptr<sznet::net::TcpConnection>_>
                     .super__Tuple_impl<1UL,_std::shared_ptr<sznet::net::TcpConnection>_>.
                     super__Head_base<1UL,_std::shared_ptr<sznet::net::TcpConnection>,_false>.
                     _M_head_impl + 8));
  return;
}

Assistant:

void KcpWithTcpServer::removeConnection(const TcpConnectionPtr& conn)
{
	// FIXME: unsafe
	m_loop->runInLoop(std::bind(&KcpWithTcpServer::removeConnectionInLoop, this, conn));
}